

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mathCoreSimplify.cpp
# Opt level: O3

void mathCore::absorbtion_law(expression *a,expression *pow)

{
  _Rb_tree_header *p_Var1;
  bool bVar2;
  iterator iVar3;
  iterator iVar4;
  const_iterator cVar5;
  expression **b;
  _Self __tmp;
  
  b = (expression **)pow;
  bVar2 = is_and(a);
  if (bVar2) {
    bVar2 = is_or(pow);
    if (((bVar2) && (bVar2 = is_negated(pow), !bVar2)) && (bVar2 = is_dualed(pow), !bVar2)) {
      b = &global_variable;
      iVar3 = std::
              _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
              ::lower_bound(&(pow->contents)._M_t,&global_variable);
      p_Var1 = &(pow->contents)._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
        do {
          bVar2 = is_var(*(expression **)(iVar3._M_node + 1));
          cVar5._M_node = iVar3._M_node;
          if (bVar2) {
            b = (expression **)(iVar3._M_node + 1);
            iVar4 = std::
                    _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                    ::find(&(a->contents)._M_t,b);
            if ((_Rb_tree_header *)iVar4._M_node ==
                &(a->contents)._M_t._M_impl.super__Rb_tree_header) {
              cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
            }
            else {
              b = *(expression ***)(iVar3._M_node + 1);
              bVar2 = same_sign(*(expression **)(iVar4._M_node + 1),(expression *)b);
              if (bVar2) {
                delete_children(pow);
                trans_true(pow);
                break;
              }
              cVar5._M_node =
                   (_Base_ptr)
                   std::
                   _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                   ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                       *)&pow->contents,iVar3._M_node);
              b = (expression **)iVar3._M_node;
            }
          }
          iVar3._M_node = cVar5._M_node;
        } while ((_Rb_tree_header *)cVar5._M_node != p_Var1);
      }
    }
  }
  else {
    bVar2 = is_or(a);
    if (bVar2) {
      bVar2 = is_and(pow);
      if (((bVar2) && (bVar2 = is_negated(pow), !bVar2)) && (bVar2 = is_dualed(pow), !bVar2)) {
        b = &global_variable;
        iVar3 = std::
                _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                ::lower_bound(&(pow->contents)._M_t,&global_variable);
        p_Var1 = &(pow->contents)._M_t._M_impl.super__Rb_tree_header;
        if ((_Rb_tree_header *)iVar3._M_node != p_Var1) {
          do {
            bVar2 = is_var(*(expression **)(iVar3._M_node + 1));
            cVar5._M_node = iVar3._M_node;
            if (bVar2) {
              b = (expression **)(iVar3._M_node + 1);
              iVar4 = std::
                      _Rb_tree<expression_*,_expression_*,_std::_Identity<expression_*>,_compareUUID,_std::allocator<expression_*>_>
                      ::find(&(a->contents)._M_t,b);
              if ((_Rb_tree_header *)iVar4._M_node ==
                  &(a->contents)._M_t._M_impl.super__Rb_tree_header) {
                cVar5._M_node = (_Base_ptr)std::_Rb_tree_increment(iVar3._M_node);
              }
              else {
                b = *(expression ***)(iVar3._M_node + 1);
                bVar2 = same_sign(*(expression **)(iVar4._M_node + 1),(expression *)b);
                if (bVar2) {
                  delete_children(pow);
                  trans_false(pow);
                  break;
                }
                cVar5._M_node =
                     (_Base_ptr)
                     std::
                     _Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                     ::erase_abi_cxx11_((_Rb_tree<expression*,expression*,std::_Identity<expression*>,compareUUID,std::allocator<expression*>>
                                         *)&pow->contents,iVar3._M_node);
                b = (expression **)iVar3._M_node;
              }
            }
            iVar3._M_node = cVar5._M_node;
          } while ((_Rb_tree_header *)cVar5._M_node != p_Var1);
        }
      }
    }
    else {
      is_var(a);
    }
  }
  empty_expression((mathCore *)pow,(expression *)b);
  return;
}

Assistant:

void mathCore::absorbtion_law(expression* a, expression* pow){
	if (is_and(a)) {
		if (is_or(pow) && !(is_negated(pow) || is_dualed(pow))) { // Needs to be a clean OR statement to POW things out of it!
			auto iter = pow->contents.lower_bound(global_variable);	// You can only pow variables
			expSet::iterator outsiders;

			while (iter != pow->contents.end()) {
				if (is_var(*iter)) { // Its guarenteed to be a variable anyway
					outsiders = a->contents.find(*iter);
					if (outsiders == a->contents.end()) {	// If we find nothing, go to the next variable
						iter++;
					}
					while(outsiders != a->contents.end()) {
						// We found something outside!
						if (same_sign(*outsiders, *iter)) {
							// Same sign, Pow just became a literal 1!
							delete_children(pow);
							trans_true(pow);
							iter = pow->contents.end();
							break;
						}
						else {
							// Different Signs -> Its irrelevant, so pow loses it!
							iter = pow->contents.erase(iter);
							break;
						}
						outsiders++;
					}
				}
			}
		}
	}
	else if (is_or(a)) {
		if (is_and(pow) && !(is_negated(pow) || is_dualed(pow))) { // Needs to be a clean AND statement to POW things out of it!
			auto iter = pow->contents.lower_bound(global_variable);	// You can only pow variables
			expSet::iterator outsiders;

			while (iter != pow->contents.end()) {
				if (is_var(*iter)) { // Its guarenteed to be a variable anyway
					outsiders = a->contents.find(*iter);
					if (outsiders == a->contents.end()) {	// If we find nothing, go to the next variable
						iter++;
					}
					while (outsiders != a->contents.end()) {
						// We found something outside!
						if (same_sign(*outsiders, *iter)) {
							// Same sign, Pow just became a literal 0!
							delete_children(pow);
							trans_false(pow);
							iter = pow->contents.end();
							break;
						}
						else {
							// Different Signs -> Its irrelevant, so pow loses it!
							iter = pow->contents.erase(iter);
							break;
						}
						outsiders++;
					}
				}
			}
		}
	}
	else if (is_var(a)) {

	}
	// You could theoretically empty pow!
	empty_expression(pow);
}